

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O3

void __thiscall
uWS::WebSocketHandshake::static_for<13,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()
          (static_for<13,_uWS::WebSocketHandshake::Sha1Loop<1>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  static_for<12,_uWS::WebSocketHandshake::Sha1Loop<1>_> local_11;
  
  static_for<12,_uWS::WebSocketHandshake::Sha1Loop<1>_>::operator()(&local_11,a,b);
  uVar1 = *a;
  a[2] = a[2] + ((a[4] ^ a[3]) & uVar1 ^ a[3]) + b[0xc] + (a[1] << 5 | a[1] >> 0x1b) + 0x5a827999;
  *a = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }